

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_33c8f::ParseDummyCommand::configureAttribute
          (ParseDummyCommand *this,ConfigureContext *param_1,StringRef name,StringRef value)

{
  int iVar1;
  StringRef local_78;
  StringRef local_68;
  string local_58;
  string local_38;
  
  local_78.Length = value.Length;
  local_78.Data = value.Data;
  local_68.Length = name.Length;
  local_68.Data = name.Data;
  iVar1 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar1 != '\0') {
    llvm::StringRef::str_abi_cxx11_(&local_38,&local_68);
    llvm::StringRef::str_abi_cxx11_(&local_58,&local_78);
    printf("  -- \'%s\': \'%s\'\n",local_38._M_dataplus._M_p,local_58._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  StringRef value) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': '%s'\n", name.str().c_str(), value.str().c_str());
    }
    return true;
  }